

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ArgumentListSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ArgumentListSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *local_60;
  size_t index_local;
  ArgumentListSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->openParen).kind;
    token._2_1_ = (this->openParen).field_0x2;
    token.numFlags.raw = (this->openParen).numFlags.raw;
    token.rawLen = (this->openParen).rawLen;
    token.info = (this->openParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    local_60 = (SyntaxNode *)0x0;
    if (this != (ArgumentListSyntax *)0xffffffffffffffe0) {
      local_60 = &(this->parameters).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_60);
  }
  else if (index == 2) {
    token_00.kind = (this->closeParen).kind;
    token_00._2_1_ = (this->closeParen).field_0x2;
    token_00.numFlags.raw = (this->closeParen).numFlags.raw;
    token_00.rawLen = (this->closeParen).rawLen;
    token_00.info = (this->closeParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ArgumentListSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openParen;
        case 1: return &parameters;
        case 2: return closeParen;
        default: return nullptr;
    }
}